

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FunctionPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPrototypeSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::DataTypeSyntax&,slang::syntax::NameSyntax&,slang::syntax::FunctionPortListSyntax*&>
          (BumpAllocator *this,Token *args,Token *args_1,DataTypeSyntax *args_2,NameSyntax *args_3,
          FunctionPortListSyntax **args_4)

{
  FunctionPortListSyntax *pFVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  FunctionPrototypeSyntax *pFVar12;
  
  pFVar12 = (FunctionPrototypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionPrototypeSyntax *)this->endPtr < pFVar12 + 1) {
    pFVar12 = (FunctionPrototypeSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pFVar12 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar2 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar3 = args_1->info;
  pFVar1 = *args_4;
  (pFVar12->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pFVar12->super_SyntaxNode).kind = FunctionPrototype;
  (pFVar12->keyword).kind = TVar4;
  (pFVar12->keyword).field_0x2 = uVar5;
  (pFVar12->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pFVar12->keyword).rawLen = uVar7;
  (pFVar12->keyword).info = pIVar2;
  (pFVar12->lifetime).kind = TVar8;
  (pFVar12->lifetime).field_0x2 = uVar9;
  (pFVar12->lifetime).numFlags = (NumericTokenFlags)NVar10.raw;
  (pFVar12->lifetime).rawLen = uVar11;
  (pFVar12->lifetime).info = pIVar3;
  (pFVar12->returnType).ptr = args_2;
  (pFVar12->name).ptr = args_3;
  pFVar12->portList = pFVar1;
  (args_2->super_ExpressionSyntax).super_SyntaxNode.parent = &pFVar12->super_SyntaxNode;
  (args_3->super_ExpressionSyntax).super_SyntaxNode.parent = &pFVar12->super_SyntaxNode;
  if (pFVar1 != (FunctionPortListSyntax *)0x0) {
    (pFVar1->super_SyntaxNode).parent = &pFVar12->super_SyntaxNode;
  }
  return pFVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }